

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O0

REF_STATUS
ref_split_edge_tet_quality
          (REF_GRID_conflict ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node,REF_BOOL *allowed
          )

{
  REF_NODE ref_node_00;
  REF_CELL ref_cell_00;
  uint uVar1;
  REF_INT local_138;
  REF_INT local_134;
  int local_130;
  REF_INT local_12c;
  double local_128;
  REF_INT local_11c;
  int local_118;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL min_existing_quality;
  REF_DBL volume1;
  REF_DBL volume0;
  REF_DBL quality1;
  REF_DBL quality0;
  REF_DBL quality;
  int local_c0;
  REF_INT node;
  REF_INT cell_node;
  REF_INT item;
  REF_INT nodes [27];
  REF_INT local_44;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_BOOL *allowed_local;
  REF_INT new_node_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID_conflict ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  ref_cell_00 = ref_grid->cell[8];
  *allowed = 0;
  _ref_private_macro_code_rss_1 = 1.0;
  if ((node0 < 0) || (ref_cell_00->ref_adj->nnode <= node0)) {
    local_118 = -1;
  }
  else {
    local_118 = ref_cell_00->ref_adj->first[node0];
  }
  node = local_118;
  if (local_118 == -1) {
    local_11c = -1;
  }
  else {
    local_11c = ref_cell_00->ref_adj->item[local_118].ref;
  }
  local_44 = local_11c;
  while (node != -1) {
    for (local_c0 = 0; local_c0 < ref_cell_00->node_per; local_c0 = local_c0 + 1) {
      if (node1 == ref_cell_00->c2n[local_c0 + ref_cell_00->size_per * local_44]) {
        uVar1 = ref_cell_nodes(ref_cell_00,local_44,&cell_node);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
                 0x252,"ref_split_edge_tet_quality",(ulong)uVar1,"cell nodes");
          return uVar1;
        }
        uVar1 = ref_node_tet_quality(ref_node_00,&cell_node,&quality0);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
                 0x254,"ref_split_edge_tet_quality",(ulong)uVar1,"q");
          return uVar1;
        }
        if (quality0 <= _ref_private_macro_code_rss_1) {
          local_128 = quality0;
        }
        else {
          local_128 = _ref_private_macro_code_rss_1;
        }
        _ref_private_macro_code_rss_1 = local_128;
      }
    }
    node = ref_cell_00->ref_adj->item[node].next;
    if (node == -1) {
      local_12c = -1;
    }
    else {
      local_12c = ref_cell_00->ref_adj->item[node].ref;
    }
    local_44 = local_12c;
  }
  if ((node0 < 0) || (ref_cell_00->ref_adj->nnode <= node0)) {
    local_130 = -1;
  }
  else {
    local_130 = ref_cell_00->ref_adj->first[node0];
  }
  node = local_130;
  if (local_130 == -1) {
    local_134 = -1;
  }
  else {
    local_134 = ref_cell_00->ref_adj->item[local_130].ref;
  }
  local_44 = local_134;
  do {
    if (node == -1) {
      *allowed = 1;
      return 0;
    }
    for (local_c0 = 0; local_c0 < ref_cell_00->node_per; local_c0 = local_c0 + 1) {
      if (node1 == ref_cell_00->c2n[local_c0 + ref_cell_00->size_per * local_44]) {
        uVar1 = ref_cell_nodes(ref_cell_00,local_44,&cell_node);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
                 0x259,"ref_split_edge_tet_quality",(ulong)uVar1,"cell nodes");
          return uVar1;
        }
        for (quality._4_4_ = 0; quality._4_4_ < ref_cell_00->node_per;
            quality._4_4_ = quality._4_4_ + 1) {
          if (node0 == (&cell_node)[quality._4_4_]) {
            (&cell_node)[quality._4_4_] = new_node;
          }
        }
        uVar1 = ref_node_tet_quality(ref_node_00,&cell_node,&quality1);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
                 0x25d,"ref_split_edge_tet_quality",(ulong)uVar1,"q0");
          return uVar1;
        }
        uVar1 = ref_node_tet_vol(ref_node_00,&cell_node,&volume1);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
                 0x25e,"ref_split_edge_tet_quality",(ulong)uVar1,"vol0");
          return uVar1;
        }
        for (quality._4_4_ = 0; quality._4_4_ < ref_cell_00->node_per;
            quality._4_4_ = quality._4_4_ + 1) {
          if (new_node == (&cell_node)[quality._4_4_]) {
            (&cell_node)[quality._4_4_] = node0;
          }
        }
        for (quality._4_4_ = 0; quality._4_4_ < ref_cell_00->node_per;
            quality._4_4_ = quality._4_4_ + 1) {
          if (node1 == (&cell_node)[quality._4_4_]) {
            (&cell_node)[quality._4_4_] = new_node;
          }
        }
        uVar1 = ref_node_tet_quality(ref_node_00,&cell_node,&volume0);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
                 0x266,"ref_split_edge_tet_quality",(ulong)uVar1,"q1");
          return uVar1;
        }
        uVar1 = ref_node_tet_vol(ref_node_00,&cell_node,&min_existing_quality);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
                 0x267,"ref_split_edge_tet_quality",(ulong)uVar1,"vol1");
          return uVar1;
        }
        if ((((quality1 < ref_grid->adapt->split_quality_absolute) ||
             (volume0 < ref_grid->adapt->split_quality_absolute)) ||
            (quality1 < ref_grid->adapt->split_quality_relative * _ref_private_macro_code_rss_1)) ||
           (((volume0 < ref_grid->adapt->split_quality_relative * _ref_private_macro_code_rss_1 ||
             (volume1 < ref_node_00->min_volume)) ||
            (min_existing_quality < ref_node_00->min_volume)))) {
          *allowed = 0;
          return 0;
        }
      }
    }
    node = ref_cell_00->ref_adj->item[node].next;
    if (node == -1) {
      local_138 = -1;
    }
    else {
      local_138 = ref_cell_00->ref_adj->item[node].ref;
    }
    local_44 = local_138;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_split_edge_tet_quality(REF_GRID ref_grid, REF_INT node0,
                                              REF_INT node1, REF_INT new_node,
                                              REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, cell_node;
  REF_INT node;
  REF_DBL quality, quality0, quality1;
  REF_DBL volume0, volume1;
  REF_DBL min_existing_quality;

  *allowed = REF_FALSE;

  min_existing_quality = 1.0;
  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");

    RSS(ref_node_tet_quality(ref_node, nodes, &quality), "q");
    min_existing_quality = MIN(min_existing_quality, quality);
  }

  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node0 == nodes[node]) nodes[node] = new_node;
    }
    RSS(ref_node_tet_quality(ref_node, nodes, &quality0), "q0");
    RSS(ref_node_tet_vol(ref_node, nodes, &volume0), "vol0");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (new_node == nodes[node]) nodes[node] = node0;
    }
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node1 == nodes[node]) nodes[node] = new_node;
    }
    RSS(ref_node_tet_quality(ref_node, nodes, &quality1), "q1");
    RSS(ref_node_tet_vol(ref_node, nodes, &volume1), "vol1");

    if (quality0 < ref_grid_adapt(ref_grid, split_quality_absolute) ||
        quality1 < ref_grid_adapt(ref_grid, split_quality_absolute) ||
        quality0 < ref_grid_adapt(ref_grid, split_quality_relative) *
                       min_existing_quality ||
        quality1 < ref_grid_adapt(ref_grid, split_quality_relative) *
                       min_existing_quality ||
        volume0 < ref_node_min_volume(ref_node) ||
        volume1 < ref_node_min_volume(ref_node)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}